

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

void proto2_unittest::TestPackedTypesLite::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DeleteOutOfLineHelper<std::__cxx11::string>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 0x11));
    google::protobuf::RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)(self + 0x10));
    google::protobuf::RepeatedField<double>::~RepeatedField((RepeatedField<double> *)(self + 0xf));
    google::protobuf::RepeatedField<float>::~RepeatedField((RepeatedField<float> *)(self + 0xe));
    google::protobuf::RepeatedField<long>::~RepeatedField((RepeatedField<long> *)(self + 0xd));
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 0xc));
    google::protobuf::RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)(self + 0xb));
    google::protobuf::RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)(self + 10));
    google::protobuf::RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)&self[8]._internal_metadata_);
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 7));
    google::protobuf::RepeatedField<unsigned_long>::~RepeatedField
              ((RepeatedField<unsigned_long> *)&self[5]._internal_metadata_);
    google::protobuf::RepeatedField<unsigned_int>::~RepeatedField
              ((RepeatedField<unsigned_int> *)(self + 4));
    google::protobuf::RepeatedField<long>::~RepeatedField
              ((RepeatedField<long> *)&self[2]._internal_metadata_);
    google::protobuf::RepeatedField<int>::~RepeatedField((RepeatedField<int> *)(self + 1));
    return;
  }
  SharedDtor((TestPackedTypesLite *)&stack0xffffffffffffffe0);
}

Assistant:

inline void TestPackedTypesLite::SharedDtor(MessageLite& self) {
  TestPackedTypesLite& this_ = static_cast<TestPackedTypesLite&>(self);
  this_._internal_metadata_.Delete<std::string>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}